

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O2

size_t __thiscall ExportDirWrapper::mapNames(ExportDirWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  IMAGE_EXPORT_DIRECTORY *pIVar3;
  undefined4 extraout_var;
  mapped_type_conflict *pmVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  pIVar3 = exportDir(this);
  if (pIVar3 == (IMAGE_EXPORT_DIRECTORY *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = (size_t)pIVar3->NumberOfNames;
    uVar7 = (ulong)pIVar3->AddressOfNameOrdinals;
    for (sVar5 = 0; sVar6 != sVar5; sVar5 = sVar5 + 1) {
      pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,uVar7,2,2,0);
      if ((key_type_conflict1 *)CONCAT44(extraout_var,iVar2) == (key_type_conflict1 *)0x0) {
        return sVar5;
      }
      pmVar4 = std::
               map<unsigned_short,_unsigned_int,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_int>_>_>
               ::operator[](&this->ordToNameId,(key_type_conflict1 *)CONCAT44(extraout_var,iVar2));
      *pmVar4 = (mapped_type_conflict)sVar5;
      uVar7 = uVar7 + 2;
    }
  }
  return sVar6;
}

Assistant:

size_t ExportDirWrapper::mapNames()
{
    IMAGE_EXPORT_DIRECTORY* exp = exportDir();
    if (exp == NULL) return 0;

    size_t maxNames = exp->NumberOfNames;

    offset_t nameOrdRVA = exp->AddressOfNameOrdinals;
    //uint64_t nameRVA = exp->AddressOfNames;
    size_t i = 0;
    for (i = 0; i < maxNames; i++) {

        WORD* nameOrd = (WORD*) this->m_Exe->getContentAt(nameOrdRVA, Executable::RVA, sizeof(WORD));
        //DWORD* name = (DWORD*) this->m_Exe->getContentAt(nameRVA, Executable::RVA, sizeof(DWORD));
        if (nameOrd == NULL) break;

        this->ordToNameId[*nameOrd] = i;//*name;

        nameOrdRVA += sizeof(WORD);
        //nameRVA += sizeof(DWORD);
    }
    return i;
}